

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O1

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float fVar20;
  undefined1 auVar19 [16];
  double dVar21;
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  uint local_134;
  uint local_130;
  ulong local_120;
  ulong local_118;
  long local_f8;
  value_type local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  if (in_pad->h < in_pad->w) {
    local_130 = in_pad->w / stride;
    local_134 = feat_blob->h / (int)local_130;
  }
  else {
    local_134 = in_pad->h / stride;
    local_130 = feat_blob->h / (int)local_134;
  }
  uVar2 = anchors->w;
  if (1 < (int)uVar2) {
    iVar3 = feat_blob->w;
    local_98._0_4_ = (undefined4)stride;
    uVar8 = (ulong)local_130;
    local_98._4_4_ = local_98._0_4_;
    local_98._8_4_ = local_98._0_4_;
    local_98._12_4_ = local_98._0_4_;
    local_120 = 0;
    do {
      if (0 < (int)local_134) {
        pvVar4 = feat_blob->data;
        sVar5 = feat_blob->elemsize;
        lVar12 = feat_blob->cstep * local_120 * sVar5;
        lVar13 = (long)feat_blob->w * sVar5;
        uVar1 = *(undefined8 *)((long)anchors->data + local_120 * 8);
        local_88._0_8_ = (undefined8)(float)uVar1;
        local_88._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
        local_f8 = (long)pvVar4 + feat_blob->cstep * sVar5 * local_120 + 0x14;
        local_118 = 0;
        do {
          if (0 < (int)local_130) {
            local_78 = ZEXT416((uint)(float)(int)local_118);
            uVar15 = 0;
            lVar11 = local_f8;
            do {
              lVar14 = (uVar15 + local_118 * uVar8) * lVar13;
              fVar16 = expf(-*(float *)((long)pvVar4 + lVar14 + lVar12 + 0x10));
              fVar16 = 1.0 / (fVar16 + 1.0);
              if (0.25 <= fVar16) {
                iVar9 = 0;
                fVar17 = -3.4028235e+38;
                if (5 < iVar3) {
                  uVar7 = 0;
                  uVar10 = 0;
                  fVar17 = -3.4028235e+38;
                  do {
                    fVar20 = *(float *)(lVar11 + uVar7 * 4);
                    if (fVar17 < fVar20) {
                      uVar10 = uVar7 & 0xffffffff;
                      fVar17 = fVar20;
                    }
                    iVar9 = (int)uVar10;
                    uVar7 = uVar7 + 1;
                  } while (iVar3 - 5 != uVar7);
                }
                fVar17 = expf(-fVar17);
                fVar16 = fVar16 * (1.0 / (fVar17 + 1.0));
                if (0.25 <= fVar16) {
                  local_48 = expf(-*(float *)((long)pvVar4 + lVar14 + lVar12));
                  fStack_44 = extraout_XMM0_Db;
                  local_58 = expf(-*(float *)((long)pvVar4 + lVar14 + lVar12 + 4));
                  fStack_54 = extraout_XMM0_Db_00;
                  local_68 = expf(-*(float *)((long)pvVar4 + lVar14 + lVar12 + 8));
                  fStack_64 = extraout_XMM0_Db_01;
                  fVar17 = expf(-*(float *)((long)pvVar4 + lVar14 + lVar12 + 0xc));
                  auVar19._4_4_ = local_58 + DAT_005f00f0._4_4_;
                  auVar19._0_4_ = local_48 + (float)DAT_005f00f0;
                  auVar19._8_4_ = fStack_44 + DAT_005f00f0._8_4_;
                  auVar19._12_4_ = fStack_54 + DAT_005f00f0._12_4_;
                  auVar23 = divps(_DAT_005f00f0,auVar19);
                  auVar6._4_4_ = fVar17 + DAT_005f00f0._4_4_;
                  auVar6._0_4_ = local_68 + (float)DAT_005f00f0;
                  auVar6._8_4_ = fStack_64 + DAT_005f00f0._8_4_;
                  auVar6._12_4_ = extraout_XMM0_Db_02 + DAT_005f00f0._12_4_;
                  auVar19 = divps(_DAT_005f00f0,auVar6);
                  dVar18 = (double)(auVar19._0_4_ + auVar19._0_4_);
                  dVar21 = (double)(auVar19._4_4_ + auVar19._4_4_);
                  fVar22 = (auVar23._0_4_ + auVar23._0_4_ + -0.5 + (float)(int)uVar15) *
                           (float)local_98._0_4_;
                  fVar24 = (auVar23._4_4_ + auVar23._4_4_ + -0.5 + (float)local_78._0_4_) *
                           (float)local_98._4_4_;
                  fVar17 = (float)(dVar18 * dVar18 * (double)local_88._0_8_) * 0.5;
                  fVar20 = (float)(dVar21 * dVar21 * (double)local_88._8_8_) * 0.5;
                  local_b8.rect.x = fVar22 - fVar17;
                  local_b8.rect.y = fVar24 - fVar20;
                  local_b8.rect.height = (fVar20 + fVar24) - local_b8.rect.y;
                  local_b8.rect.width = (fVar17 + fVar22) - local_b8.rect.x;
                  local_b8.label = iVar9;
                  local_b8.prob = fVar16;
                  std::vector<Object,_std::allocator<Object>_>::push_back(objects,&local_b8);
                }
              }
              uVar15 = uVar15 + 1;
              lVar11 = lVar11 + lVar13;
            } while (uVar15 != uVar8);
          }
          local_118 = local_118 + 1;
          local_f8 = local_f8 + lVar13 * uVar8;
        } while (local_118 != local_134);
      }
      local_120 = local_120 + 1;
    } while (local_120 != uVar2 >> 1);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = feat_blob.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = feat_blob.w - 5;

    const int num_anchors = anchors.w / 2;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        const ncnn::Mat feat = feat_blob.channel(q);

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                const float* featptr = feat.row(i * num_grid_x + j);
                float box_confidence = sigmoid(featptr[4]);
                if (box_confidence >= prob_threshold)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int k = 0; k < num_class; k++)
                    {
                        float score = featptr[5 + k];
                        if (score > class_score)
                        {
                            class_index = k;
                            class_score = score;
                        }
                    }
                    float confidence = box_confidence * sigmoid(class_score);
                    if (confidence >= prob_threshold)
                    {
                        // yolov5/models/yolo.py Detect forward
                        // y = x[i].sigmoid()
                        // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                        // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                        float dx = sigmoid(featptr[0]);
                        float dy = sigmoid(featptr[1]);
                        float dw = sigmoid(featptr[2]);
                        float dh = sigmoid(featptr[3]);

                        float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                        float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                        float pb_w = pow(dw * 2.f, 2) * anchor_w;
                        float pb_h = pow(dh * 2.f, 2) * anchor_h;

                        float x0 = pb_cx - pb_w * 0.5f;
                        float y0 = pb_cy - pb_h * 0.5f;
                        float x1 = pb_cx + pb_w * 0.5f;
                        float y1 = pb_cy + pb_h * 0.5f;

                        Object obj;
                        obj.rect.x = x0;
                        obj.rect.y = y0;
                        obj.rect.width = x1 - x0;
                        obj.rect.height = y1 - y0;
                        obj.label = class_index;
                        obj.prob = confidence;

                        objects.push_back(obj);
                    }
                }
            }
        }
    }
}